

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerThread.cxx
# Opt level: O2

bool testStackFrameFunctionName(void)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_a1;
  shared_ptr<cmDebugger::cmDebuggerThread> thread;
  StackTraceResponse stackTrace;
  cmListFileFunction func;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_58;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_40;
  string local_28;
  
  stackTrace.stackFrames.super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  std::make_shared<cmDebugger::cmDebuggerThread,int,char_const(&)[5]>
            ((int *)&thread,(char (*) [5])&stackTrace);
  local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"function_name",(allocator<char> *)&stackTrace);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector(&local_40,&local_58);
  cmListFileFunction::cmListFileFunction(&func,&local_28,10,0x14,&local_40);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_40);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stackTrace,"CMakeLists.txt",&local_a1);
  cmDebugger::cmDebuggerThread::PushStackFrame
            (thread.super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(cmMakefile *)0x0,(string *)&stackTrace,&func);
  std::__cxx11::string::~string((string *)&stackTrace);
  cmDebugger::GetStackTraceResponse(&stackTrace,&thread);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (CONCAT44(stackTrace.stackFrames.
                                    super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    stackTrace.stackFrames.
                                    super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) + 0xa8),
                          "function_name");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(stackTrace.stackFrames[0].name == functionName) failed on line "
                            );
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x18);
    std::operator<<(poVar2,"\n");
  }
  std::vector<dap::StackFrame,_std::allocator<dap::StackFrame>_>::~vector(&stackTrace.stackFrames);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&func.Impl.
              super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&thread.super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar1;
}

Assistant:

static bool testStackFrameFunctionName()
{
  auto thread = std::make_shared<cmDebugger::cmDebuggerThread>(0, "name");
  const auto* functionName = "function_name";
  auto arguments = std::vector<cmListFileArgument>{};
  cmListFileFunction func(functionName, 10, 20, arguments);
  thread->PushStackFrame(nullptr, "CMakeLists.txt", func);

  auto stackTrace = GetStackTraceResponse(thread);

  ASSERT_TRUE(stackTrace.stackFrames[0].name == functionName);
  return true;
}